

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O2

int mbedtls_x509write_crt_set_subject_key_identifier(mbedtls_x509write_cert *ctx)

{
  uint uVar1;
  uint uVar2;
  size_t val_len;
  uchar *c;
  uchar buf [2068];
  uchar local_34 [12];
  
  c = local_34;
  memset(buf,0,0x814);
  uVar1 = mbedtls_pk_write_pubkey(&c,buf,ctx->subject_key);
  if (-1 < (int)uVar1) {
    uVar1 = mbedtls_sha1_ret(local_34 + -(ulong)uVar1,(ulong)uVar1,buf + 0x800);
    if (((uVar1 == 0) &&
        (c = buf + 0x800, uVar2 = mbedtls_asn1_write_len(&c,buf,0x14), uVar1 = uVar2,
        -1 < (int)uVar2)) && (uVar1 = mbedtls_asn1_write_tag(&c,buf,'\x04'), -1 < (int)uVar1)) {
      val_len = (ulong)uVar2 + (ulong)uVar1 + 0x14;
      uVar1 = mbedtls_x509_set_extension
                        (&ctx->extensions,"U\x1d\x0e",3,0,local_34 + -val_len,val_len);
    }
  }
  return uVar1;
}

Assistant:

int mbedtls_x509write_crt_set_subject_key_identifier( mbedtls_x509write_cert *ctx )
{
    int ret;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE * 2 + 20]; /* tag, length + 2xMPI */
    unsigned char *c = buf + sizeof(buf);
    size_t len = 0;

    memset( buf, 0, sizeof(buf) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_pk_write_pubkey( &c, buf, ctx->subject_key ) );

    ret = mbedtls_sha1_ret( buf + sizeof( buf ) - len, len,
                            buf + sizeof( buf ) - 20 );
    if( ret != 0 )
        return( ret );
    c = buf + sizeof( buf ) - 20;
    len = 20;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_OCTET_STRING ) );

    return mbedtls_x509write_crt_set_extension( ctx, MBEDTLS_OID_SUBJECT_KEY_IDENTIFIER,
                                        MBEDTLS_OID_SIZE( MBEDTLS_OID_SUBJECT_KEY_IDENTIFIER ),
                                        0, buf + sizeof(buf) - len, len );
}